

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall Image::displayImage(Image *this)

{
  string window_name;
  string asStack_48 [32];
  _InputArray local_28;
  
  std::__cxx11::string::string(asStack_48,"GNG",(allocator *)&local_28);
  cv::namedWindow(asStack_48,0);
  local_28.sz.width = 0;
  local_28.sz.height = 0;
  local_28.flags = 0x1010000;
  local_28.obj = this;
  cv::imshow(asStack_48,&local_28);
  cv::waitKey(0);
  std::__cxx11::string::~string(asStack_48);
  return;
}

Assistant:

void Image::displayImage() {
    std::string window_name = "GNG";
    cv::namedWindow(window_name, cv::WINDOW_NORMAL);
    cv::imshow(window_name, content);
    cv::waitKey(0);
}